

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zvgPort.c
# Opt level: O3

uint getByteNb(uchar *byte)

{
  byte bVar1;
  byte bVar2;
  uint uVar3;
  
  if (((byte)ZvgIO.ecpFlags & 2) == 0) {
    return 0x18;
  }
  bVar1 = in((undefined2)ZvgIO.ecpDsr);
  if ((bVar1 & 0x20) != 0) {
    ZvgIO.ecpDcrState = ZvgIO.ecpDcrState | 2;
    out((undefined2)ZvgIO.ecpDcr,ZvgIO.ecpDcrState);
    uVar3 = waitForDsrNE('\b','\b',1000);
    ZvgIO.ecpDcrState = ZvgIO.ecpDcrState & 0xfd;
    out((undefined2)ZvgIO.ecpDcr,ZvgIO.ecpDcrState);
    if (uVar3 == 0xffffffff) {
      terminate_1284();
      return 0x13;
    }
    uVar3 = waitForDsrNE(' ',' ',100);
    if (uVar3 == 0xffffffff) goto LAB_001047e4;
  }
  ZvgIO.ecpDcrState = ZvgIO.ecpDcrState | 2;
  out((undefined2)ZvgIO.ecpDcr,ZvgIO.ecpDcrState);
  uVar3 = waitForDsrNE('@','@',100);
  if (uVar3 != 0xffffffff) {
    bVar1 = in((undefined2)ZvgIO.ecpDsr);
    ZvgIO.ecpDcrState = ZvgIO.ecpDcrState & 0xfd;
    out((undefined2)ZvgIO.ecpDcr,ZvgIO.ecpDcrState);
    uVar3 = waitForDsrNE('@','\0',100);
    if (uVar3 != 0xffffffff) {
      ZvgIO.ecpDcrState = ZvgIO.ecpDcrState | 2;
      out((undefined2)ZvgIO.ecpDcr,ZvgIO.ecpDcrState);
      uVar3 = waitForDsrNE('@','@',100);
      if (uVar3 != 0xffffffff) {
        bVar2 = in((undefined2)ZvgIO.ecpDsr);
        ZvgIO.ecpDcrState = ZvgIO.ecpDcrState & 0xfd;
        out((undefined2)ZvgIO.ecpDcr,ZvgIO.ecpDcrState);
        uVar3 = waitForDsrNE('@','\0',100);
        if (uVar3 != 0xffffffff) {
          *byte = (bVar2 & 0x80 | bVar1 >> 4 & 8 | bVar1 >> 3 & 7 | bVar2 * '\x02' & 0x70) ^ 0x88;
          return 0;
        }
      }
    }
  }
LAB_001047e4:
  out((undefined2)ZvgIO.ecpDcr,0xc);
  ZvgIO.ecpFlags._0_1_ = (byte)ZvgIO.ecpFlags & 0xfc;
  ZvgIO.ecpDcrState = '\f';
  return 0x15;
}

Assistant:

static uint getByteNb( uchar *byte)
{
	uint	loNib, hiNib;

	// check for proper mode

	if (!(ZvgIO.ecpFlags & ECPF_NIBBLE))
		return (errEcpBadMode);		// not in Nibble mode

	// has data just become available?

	if (rdsr() & DSR_AckDataReq)
	{	cdcr( DCR_HostBusy);			// indicate host is not busy

		// check to see if the peripheral is indicating that data is available
		// wait for awhile.  Check for a full second to see if data is available.

		if (waitForDsrNE( DSR_nDataAvail, DSR_nDataAvail, PERIPH_WAIT) == ZVG_TIMEOUT)
		{	sdcr( DCR_HostBusy);		// host is once again busy
			terminate_1284();			// if no data, leave NIBBLE mode
			return (errEcpNoData);
		}

		sdcr( DCR_HostBusy);			// indicate host has received the IRQ

		// wait for P. to ack

		if (waitForDsrNE( DSR_AckDataReq, DSR_AckDataReq, PERIPH_TIMEOUT) == ZVG_TIMEOUT)
			goto WaitTimeout;	
	}
	cdcr( DCR_HostBusy);				// indicate host is not busy

	// wait for P. response

	if (waitForDsrNE( DSR_PtrClk, DSR_PtrClk, PERIPH_TIMEOUT) == ZVG_TIMEOUT)
		goto WaitTimeout;

	// when data is ready, read it.

	loNib = rdsr();

	// indicate we've read the data

	sdcr( DCR_HostBusy);

	// shift the bits around to build a real nibble

	loNib = ((loNib >> 3) & 0x07) | ((loNib & DSR_Busy) >> 4);

	// wait for the P. to know we've read the data

	if (waitForDsrNE( DSR_PtrClk, 0, PERIPH_TIMEOUT) == ZVG_TIMEOUT)
		goto WaitTimeout;

	// indicate were ready for more data
 
	cdcr( DCR_HostBusy);

	// wait for data

	if (waitForDsrNE( DSR_PtrClk, DSR_PtrClk, PERIPH_TIMEOUT) == ZVG_TIMEOUT)
		goto WaitTimeout;

	// read next nibble

	hiNib = rdsr();

	// tell the P. we've got it.

	sdcr( DCR_HostBusy);

	// shift into real nibble

	hiNib = ((hiNib << 1) & 0x70) | (hiNib & DSR_Busy);

	// wait for P. to catch up

	if (waitForDsrNE( DSR_PtrClk, 0, PERIPH_TIMEOUT) == ZVG_TIMEOUT)
		goto WaitTimeout;

	// return the full byte

	*byte = hiNib | loNib;
	return (errOk);

WaitTimeout:
	compatibility();
	return (errEcpTimeout);
}